

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsg_model.c
# Opt level: O3

int fsg_model_accept(fsg_model_t *fsg,char *words)

{
  long lVar1;
  char *word_00;
  fsg_model_t *fsg_00;
  int iVar2;
  uint uVar3;
  int iVar4;
  bitvec_t *pbVar5;
  bitvec_t *ptr;
  fsg_arciter_t *itor;
  gnode_t *pgVar6;
  uint uVar7;
  int iVar8;
  bitvec_t *active;
  char delimfound;
  char *word;
  char local_59;
  char *local_58;
  fsg_model_t *local_50;
  uint local_44;
  char *local_40;
  bitvec_t *local_38;
  
  uVar3 = 0;
  if (words != (char *)0x0 && fsg != (fsg_model_t *)0x0) {
    iVar4 = fsg->n_state + 0x1f;
    iVar2 = fsg->n_state + 0x3e;
    if (-1 < iVar4) {
      iVar2 = iVar4;
    }
    pbVar5 = (bitvec_t *)
             __ckd_calloc__((long)(iVar2 >> 5),4,
                            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/fsg_model.c"
                            ,0x3c3);
    iVar4 = fsg->n_state + 0x1f;
    iVar2 = fsg->n_state + 0x3e;
    if (-1 < iVar4) {
      iVar2 = iVar4;
    }
    ptr = (bitvec_t *)
          __ckd_calloc__((long)(iVar2 >> 5),4,
                         "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/fsg_model.c"
                         ,0x3c4);
    iVar4 = fsg->start_state;
    iVar2 = iVar4 + 0x1f;
    if (-1 < iVar4) {
      iVar2 = iVar4;
    }
    pbVar5[iVar2 >> 5] = pbVar5[iVar2 >> 5] | 1 << ((byte)iVar4 & 0x1f);
    local_50 = fsg;
    local_40 = __ckd_salloc__(words,
                              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/fsg_model.c"
                              ,0x3c8);
    uVar3 = nextword(local_40," \t\r\n\v\f",&local_58,&local_59);
    word_00 = local_58;
    fsg_00 = local_50;
    while (active = pbVar5, local_50 = fsg_00, -1 < (int)uVar3) {
      local_58 = word_00;
      local_38 = active;
      iVar4 = fsg_model_word_id(fsg_00,word_00);
      active = local_38;
      err_msg(ERR_INFO,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/fsg_model.c"
              ,0x3cf,"word: %s\n",word_00);
      apply_closure(fsg_00,active);
      if (iVar4 < 0) {
        uVar3 = 0;
        err_msg(ERR_INFO,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/fsg_model.c"
                ,0x3d7,"word %s not found!\n",local_58);
        goto LAB_0010bdd7;
      }
      iVar2 = fsg_00->n_state;
      local_44 = uVar3;
      if (0 < iVar2) {
        uVar3 = 0;
        do {
          if ((active[uVar3 >> 5] >> (uVar3 & 0x1f) & 1) != 0) {
            for (itor = fsg_model_arcs(local_50,uVar3); itor != (fsg_arciter_t *)0x0;
                itor = fsg_arciter_next(itor)) {
              pgVar6 = itor->gn;
              if (pgVar6 == (gnode_t *)0x0) {
                pgVar6 = (gnode_t *)&itor->null_itor->ent->val;
              }
              lVar1 = (pgVar6->data).i;
              if (*(int *)(lVar1 + 0xc) == iVar4) {
                iVar2 = *(int *)(lVar1 + 4);
                iVar8 = iVar2 + 0x1f;
                if (-1 < iVar2) {
                  iVar8 = iVar2;
                }
                ptr[iVar8 >> 5] = ptr[iVar8 >> 5] | 1 << ((byte)iVar2 & 0x1f);
                err_msg(ERR_INFO,
                        "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/fsg_model.c"
                        ,0x3e6,"%s %d -> %d\n",local_58,(ulong)uVar3,*(undefined4 *)(lVar1 + 4));
              }
            }
          }
          uVar3 = uVar3 + 1;
          iVar2 = local_50->n_state;
        } while ((int)uVar3 < iVar2);
      }
      iVar4 = iVar2 + 0x3e;
      if (-1 < iVar2 + 0x1f) {
        iVar4 = iVar2 + 0x1f;
      }
      memset(active,0,(long)(iVar4 >> 5) << 2);
      local_58[local_44] = local_59;
      uVar3 = nextword(local_58 + local_44," \t\r\n\v\f",&local_58,&local_59);
      pbVar5 = ptr;
      ptr = active;
      word_00 = local_58;
      fsg_00 = local_50;
    }
    apply_closure(fsg_00,active);
    uVar3 = fsg_00->final_state;
    uVar7 = uVar3 + 0x1f;
    if (-1 < (int)uVar3) {
      uVar7 = uVar3;
    }
    uVar3 = (uint)((active[(int)uVar7 >> 5] >> (uVar3 & 0x1f) & 1) != 0);
LAB_0010bdd7:
    ckd_free(active);
    ckd_free(ptr);
    ckd_free(local_40);
  }
  return uVar3;
}

Assistant:

int
fsg_model_accept(fsg_model_t *fsg, char const *words)
{
    char *ptr, *mutable_words, *word, delimfound;
    bitvec_t *active, *next;
    int n, found = 0;

    if (fsg == NULL || words == NULL)
        return 0;

    active = bitvec_alloc(fsg_model_n_state(fsg));
    next = bitvec_alloc(fsg_model_n_state(fsg));
    bitvec_set(active, fsg_model_start_state(fsg));

    /* For each input word */
    ptr = mutable_words = ckd_salloc(words);
    while ((n = nextword(ptr, " \t\r\n\v\f",
                         &word, &delimfound)) >= 0) {
        int wid = fsg_model_word_id(fsg, word);
        int state;
        bitvec_t *tmp;

        E_INFO("word: %s\n", word);
        /* Expand using previously calculated closure. */
        apply_closure(fsg, active);

        /* Consume the current word, following all non-epsilon
         * transitions possible. */
        if (wid < 0) {
            /* Immediate fail */
            E_INFO("word %s not found!\n", word);
            goto done;
        }
        /* Again, my apologies, this is a bit slow. */
        for (state = 0; state < fsg_model_n_state(fsg); ++state) {
            fsg_arciter_t *itor;
            if (!bitvec_is_set(active, state))
                continue;
            for (itor = fsg_model_arcs(fsg, state);
                 itor != NULL; itor = fsg_arciter_next(itor)) {
                fsg_link_t *link = fsg_arciter_get(itor);
                /* Ignore epsilons, we already did them. */
                if (link->wid == wid) {
                    bitvec_set(next, link->to_state);
                    E_INFO("%s %d -> %d\n",
                           word, state, link->to_state);
                }
            }
        }

        /* Update active list. */
        tmp = active;
        active = next;
        next = tmp;
        bitvec_clear_all(next, fsg_model_n_state(fsg));
        
        word[n] = delimfound;
        ptr = word + n;
    }
    /* Did we reach the final state? First expand any epsilons, then
     * we'll find out! */
    apply_closure(fsg, active);
    found = bitvec_is_set(active, fsg_model_final_state(fsg));

done:
    bitvec_free(active);
    bitvec_free(next);
    ckd_free(mutable_words);
    return found != 0;
}